

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int derive_secret(ptls_key_schedule_t *sched,void *secret,char *label)

{
  st_ptls_hash_context_t *psVar1;
  int iVar2;
  uint8_t hash_value [64];
  
  psVar1 = sched->hashes[0].ctx;
  (*psVar1->final)(psVar1,hash_value,PTLS_HASH_FINAL_MODE_SNAPSHOT);
  iVar2 = derive_secret_with_hash(sched,secret,label,hash_value);
  (*ptls_clear_memory)(hash_value,0x40);
  return iVar2;
}

Assistant:

static int derive_secret(ptls_key_schedule_t *sched, void *secret, const char *label)
{
    uint8_t hash_value[PTLS_MAX_DIGEST_SIZE];

    sched->hashes[0].ctx->final(sched->hashes[0].ctx, hash_value, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    int ret = derive_secret_with_hash(sched, secret, label, hash_value);
    ptls_clear_memory(hash_value, sizeof(hash_value));
    return ret;
}